

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O1

double __thiscall
chrono::fea::ChElementShellANCF_3833::GetVonMissesStress
          (ChElementShellANCF_3833 *this,double layer,double xi,double eta,double layer_zeta)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  pointer pLVar16;
  long lVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ChKblockGeneric *pCVar23;
  double *pdVar24;
  Index row;
  ChElementShellANCF_3833 *this_00;
  ChElementShellANCF_3833 *this_01;
  ActualDstType actualDst;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  double dVar39;
  undefined1 auVar40 [16];
  double dVar47;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  ChMatrixNMc<double,_3,_3> F;
  ChVectorN<double,_6> sigmaPK2;
  ChMatrixNM<double,_3,_3> SPK2;
  ChMatrix33<double> S;
  ChMatrixNM<double,_6,_6> D;
  ChMatrix33<double> J_0xi;
  Matrix3xN e_bar;
  MatrixNx3c Sxi_D;
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  double local_950;
  double dStack_948;
  Matrix<double,_3,_3,_0,_3,_3> local_940;
  double local_8e0 [6];
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [16];
  undefined1 local_890 [16];
  Matrix<double,_3,_3,_0,_3,_3> local_880;
  ChMatrix33<double> local_838;
  Matrix<double,_3,_3,_0,_3,_3> *local_7f0;
  Matrix<double,_3,_3,_0,_3,_3> *local_7e8;
  Matrix<double,_3,_3,_0,_3,_3> *local_7e0;
  double local_7d0;
  undefined1 local_7c0 [584];
  double dStack_578;
  double dStack_570;
  double dStack_568;
  double dStack_560;
  double dStack_558;
  double dStack_550;
  double dStack_548;
  double local_540;
  undefined1 local_500 [16];
  double local_4f0;
  double local_4e8;
  double local_4e0;
  double local_4d8;
  double local_4d0;
  double local_4c8;
  double local_4c0;
  double local_4b8;
  MatrixNx3c *local_4b0;
  Matrix<double,_3,_3,_1,_3,_3> *local_4a8;
  double local_4a0;
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  auVar38._8_56_ = in_register_00001208;
  auVar38._0_8_ = layer;
  lVar25 = vcvttsd2usi_avx512f(auVar38._0_16_);
  dVar39 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar25].m_thickness;
  Calc_Sxi_D(this,(MatrixNx3c *)local_2c0,xi,eta,layer_zeta,dVar39,
             ((this->m_layer_zoffsets).super__Vector_base<double,_Eigen::aligned_allocator<double>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar25] - this->m_thicknessZ * 0.5) +
             dVar39 * 0.5 + this->m_midsurfoffset);
  local_540 = 0.0;
  local_7c0._576_8_ = 0.0;
  dStack_578 = 0.0;
  dStack_570 = 0.0;
  dStack_568 = 0.0;
  dStack_560 = 0.0;
  dStack_558 = 0.0;
  dStack_550 = 0.0;
  dStack_548 = 0.0;
  local_500._0_8_ = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,24,1,3,24>,Eigen::Matrix<double,24,3,0,24,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,3,3,1,3,3>>
            ((Matrix<double,_3,_3,_1,_3,_3> *)(local_7c0 + 0x240),&this->m_ebar0,
             (MatrixNx3c *)local_2c0,(Scalar *)local_500);
  local_7c0._0_8_ = (MatrixNx3c *)local_2c0;
  local_7c0._8_8_ = (Matrix<double,_3,_3,_1,_3,_3> *)(local_7c0 + 0x240);
  local_500._0_8_ = (MatrixNx3c *)local_2c0;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_1,_3,_3> *)(local_500 + 8),(SrcXprType *)(local_7c0 + 8),
        (assign_op<double,_double> *)&local_940);
  local_4b0 = (MatrixNx3c *)local_500._0_8_;
  local_4a0 = 1.48219693752374e-323;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_500._8_8_;
  auVar30 = vbroadcastsd_avx512f(auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_4e0;
  auVar31 = vbroadcastsd_avx512f(auVar27);
  auVar38 = *(undefined1 (*) [64])
             (((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array;
  auVar32 = vmulpd_avx512f(auVar38,auVar30);
  auVar1 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array + 8);
  auVar2 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array + 0x10);
  auVar3 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array + 0x18);
  auVar4 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array + 0x20);
  auVar33 = vfmadd231pd_avx512f(auVar32,auVar3,auVar31);
  auVar32 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
              m_storage).m_data.array + 0x30);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_4c8;
  auVar34 = vbroadcastsd_avx512f(auVar28);
  local_2c0 = vfmadd231pd_avx512f(auVar33,auVar32,auVar34);
  auVar33 = vmulpd_avx512f(auVar30,auVar1);
  auVar35 = vfmadd231pd_avx512f(auVar33,auVar4,auVar31);
  auVar33 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
              m_storage).m_data.array + 0x38);
  local_280 = vfmadd231pd_avx512f(auVar35,auVar33,auVar34);
  auVar35 = vmulpd_avx512f(auVar30,auVar2);
  auVar30 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
              m_storage).m_data.array + 0x28);
  auVar35 = vfmadd231pd_avx512f(auVar35,auVar30,auVar31);
  auVar31 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
              m_storage).m_data.array + 0x40);
  local_240 = vfmadd231pd_avx512f(auVar35,auVar31,auVar34);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_4f0;
  auVar34 = vbroadcastsd_avx512f(auVar29);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_4d8;
  auVar35 = vbroadcastsd_avx512f(auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_4c0;
  auVar36 = vbroadcastsd_avx512f(auVar6);
  auVar37 = vmulpd_avx512f(auVar38,auVar34);
  auVar37 = vfmadd231pd_avx512f(auVar37,auVar3,auVar35);
  local_200 = vfmadd231pd_avx512f(auVar37,auVar32,auVar36);
  auVar37 = vmulpd_avx512f(auVar1,auVar34);
  auVar37 = vfmadd231pd_avx512f(auVar37,auVar4,auVar35);
  local_1c0 = vfmadd231pd_avx512f(auVar37,auVar33,auVar36);
  auVar34 = vmulpd_avx512f(auVar2,auVar34);
  auVar34 = vfmadd231pd_avx512f(auVar34,auVar30,auVar35);
  local_180 = vfmadd231pd_avx512f(auVar34,auVar31,auVar36);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_4e8;
  auVar34 = vbroadcastsd_avx512f(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_4d0;
  auVar35 = vbroadcastsd_avx512f(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_4b8;
  auVar36 = vbroadcastsd_avx512f(auVar9);
  auVar38 = vmulpd_avx512f(auVar38,auVar34);
  auVar38 = vfmadd231pd_avx512f(auVar38,auVar35,auVar3);
  local_140 = vfmadd231pd_avx512f(auVar38,auVar36,auVar32);
  auVar38 = vmulpd_avx512f(auVar1,auVar34);
  auVar38 = vfmadd231pd_avx512f(auVar38,auVar35,auVar4);
  local_100 = vfmadd231pd_avx512f(auVar38,auVar36,auVar33);
  auVar38 = vmulpd_avx512f(auVar2,auVar34);
  auVar38 = vfmadd231pd_avx512f(auVar38,auVar30,auVar35);
  local_c0 = vfmadd231pd_avx512f(auVar38,auVar31,auVar36);
  local_4a8 = (Matrix<double,_3,_3,_1,_3,_3> *)(local_500 + 8);
  CalcCoordMatrix(this,(Matrix3xN *)local_500);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_7c0._0_8_ = (_func_int **)0x3ff0000000000000;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,24,1,3,24>,Eigen::Matrix<double,24,3,0,24,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,3,3,0,3,3>>
            (&local_940,(Matrix3xN *)local_500,(MatrixNx3c *)local_2c0,(Scalar *)local_7c0);
  dVar18 = (local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5] *
            local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5] +
            local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3] *
            local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3] +
            local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4] *
            local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4] + -1.0) * 0.5;
  dVar39 = local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] *
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8] +
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] *
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6] +
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4] *
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
  dVar47 = local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2] *
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] +
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0] *
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] +
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1] *
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar47;
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] * local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] +
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] * local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] * local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dVar39;
  auVar66._8_8_ = 0;
  auVar66._0_8_ =
       (local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] *
        local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] +
        local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] *
        local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] +
        local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7] *
        local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7] + -1.0) * 0.5;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar18;
  auVar70._8_8_ = 0;
  auVar70._0_8_ =
       (local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] *
        local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] +
        local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] *
        local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] +
        local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] *
        local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] + -1.0) * 0.5;
  if (this->m_damping_enabled == true) {
    local_8b0 = auVar70;
    local_8a0 = auVar66;
    local_890 = auVar57;
    CalcCoordDerivMatrix(this,(Matrix3xN *)local_7c0);
    local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = 0.0;
    local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
         = 0.0;
    local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = 0.0;
    local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
         = 0.0;
    local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
         = 0.0;
    local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
         = 0.0;
    local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6]
         = 0.0;
    local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
         = 0.0;
    local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
         = 0.0;
    local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,3,24,1,3,24>,Eigen::Matrix<double,24,3,0,24,3>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,3,3,0,3,3>>
              (&local_880,(Matrix3xN *)local_7c0,(Matrix<double,_24,_3,_0,_24,_3> *)local_2c0,
               (Scalar *)&local_838);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = this->m_Alpha;
    auVar19._8_8_ =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar19._0_8_ =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar22._8_8_ =
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar22._0_8_ =
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar26 = vmulpd_avx512vl(auVar19,auVar22);
    auVar62._8_8_ = 0;
    auVar62._0_8_ =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar74._8_8_ = 0;
    auVar74._0_8_ =
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar27 = vmulsd_avx512f(auVar62,auVar74);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_8b0._0_8_;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = auVar26._0_8_ + auVar26._8_8_ + auVar27._0_8_;
    auVar26 = vfmadd213sd_fma(auVar58,auVar40,auVar10);
    auVar20._8_8_ =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar20._0_8_ =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar68._8_8_ = 0;
    auVar68._0_8_ =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar18;
    auVar67._8_8_ = 0;
    auVar67._0_8_ =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] *
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] *
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar27 = vfmadd213sd_fma(auVar67,auVar40,auVar11);
    auVar21._8_8_ =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar21._0_8_ =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar71._0_8_ =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar71._8_8_ =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar72._8_8_ = 0;
    auVar72._0_8_ =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar73._8_8_ = 0;
    auVar73._0_8_ =
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar28 = vmulsd_avx512f(auVar72,auVar73);
    auVar28 = vaddsd_avx512f(auVar71,auVar28);
    auVar52._0_8_ =
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar52._8_8_ =
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar29 = vmulsd_avx512f(auVar68,auVar73);
    auVar29 = vaddsd_avx512f(auVar52,auVar29);
    local_960 = vunpcklpd_avx(auVar26,auVar27);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_8a0._0_8_;
    auVar26 = vfmadd213sd_fma(auVar28,auVar40,auVar12);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar39;
    auVar53._8_8_ = 0;
    auVar53._0_8_ =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] + auVar29._0_8_;
    auVar27 = vfmadd213sd_fma(auVar53,auVar40,auVar13);
    local_970 = vunpcklpd_avx(auVar26,auVar27);
    auVar26 = vmulpd_avx512vl(auVar22,auVar21);
    auVar27 = vmulsd_avx512f(auVar74,auVar72);
    auVar28 = vmulpd_avx512vl(auVar22,auVar20);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_890._0_8_;
    auVar54._8_8_ = 0;
    auVar54._0_8_ =
         auVar26._0_8_ + auVar26._8_8_ + auVar27._0_8_ +
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] +
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] +
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] *
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar26 = vfmadd213sd_fma(auVar54,auVar40,auVar14);
    auVar75._8_8_ = 0;
    auVar75._0_8_ =
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar27 = vmulsd_avx512f(auVar75,auVar68);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar47;
    auVar49._8_8_ = 0;
    auVar49._0_8_ =
         auVar28._0_8_ + auVar28._8_8_ + auVar27._0_8_ +
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] *
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] *
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar27 = vfmadd213sd_fma(auVar49,auVar40,auVar15);
    auVar26 = vunpcklpd_avx(auVar26,auVar27);
  }
  else {
    local_960 = vunpcklpd_avx(auVar70,auVar69);
    local_970 = vunpcklpd_avx(auVar66,auVar65);
    auVar26 = vunpcklpd_avx(auVar57,auVar48);
  }
  pLVar16 = (this->m_layers).
            super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar17 = (long)pLVar16[lVar25].m_material.
                 super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  this_01 = (ChElementShellANCF_3833 *)
            pLVar16[lVar25].m_material.
            super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 == (ChElementShellANCF_3833 *)0x0) {
    this_00 = (ChElementShellANCF_3833 *)local_7c0;
    memcpy(this_00,(void *)(lVar17 + 0x20),0x120);
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pCVar23 = (ChKblockGeneric *)
                ((long)&(this_01->super_ChElementShell).super_ChElementGeneric + 8);
      *(int *)&(pCVar23->super_ChKblock)._vptr_ChKblock =
           *(int *)&(pCVar23->super_ChKblock)._vptr_ChKblock + 1;
      UNLOCK();
    }
    else {
      pCVar23 = (ChKblockGeneric *)
                ((long)&(this_01->super_ChElementShell).super_ChElementGeneric + 8);
      *(int *)&(pCVar23->super_ChKblock)._vptr_ChKblock =
           *(int *)&(pCVar23->super_ChKblock)._vptr_ChKblock + 1;
    }
    this_00 = (ChElementShellANCF_3833 *)local_7c0;
    memcpy(this_00,(void *)(lVar17 + 0x20),0x120);
    if (this_01 != (ChElementShellANCF_3833 *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      this_00 = this_01;
    }
  }
  RotateReorderStiffnessMatrix
            (this_00,(ChMatrixNM<double,_6,_6> *)local_7c0,
             (this->m_layers).
             super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar25].m_theta);
  pdVar24 = (double *)(local_7c0 + 0x20);
  lVar25 = 0;
  local_950 = auVar26._0_8_;
  dStack_948 = auVar26._8_8_;
  do {
    dVar39 = (double)local_960._0_8_ * pdVar24[-4] +
             (double)local_970._0_8_ * pdVar24[-2] + local_950 * *pdVar24;
    dVar47 = (double)local_960._8_8_ * pdVar24[-3] +
             (double)local_970._8_8_ * pdVar24[-1] + dStack_948 * pdVar24[1];
    auVar41._0_8_ = dVar39 + dVar47;
    auVar41._8_8_ = dVar39 + dVar47;
    dVar39 = (double)vmovlpd_avx(auVar41);
    local_8e0[lVar25] = dVar39;
    lVar25 = lVar25 + 1;
    pdVar24 = pdVar24 + 6;
  } while (lVar25 != 6);
  local_7e8 = &local_880;
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       local_8e0[0];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       local_8e0[1];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       local_8e0[2];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       local_8e0[3];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       local_8e0[3];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       local_8e0[4];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       local_8e0[4];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       local_8e0[5];
  local_880.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       local_8e0[5];
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5] * local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  auVar26 = vfmsub231sd_fma(auVar63,auVar42,auVar50);
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] * local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  auVar27 = vfmsub231sd_fma(auVar55,auVar64,auVar50);
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] * local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4];
  auVar28 = vfmsub231sd_fma(auVar43,auVar64,auVar59);
  local_7d0 = auVar28._0_8_ *
              local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[6] +
              (auVar26._0_8_ *
               local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0] -
              auVar27._0_8_ *
              local_940.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[3]);
  local_7f0 = &local_940;
  local_7e0 = &local_940;
  ChMatrix33<double>::
  ChMatrix33<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
            (&local_838,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
              *)&local_7f0);
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       (local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] -
       local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]) *
       (local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] -
       local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]);
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] -
       local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar26 = vfmadd231sd_fma(auVar44,auVar60,auVar60);
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] -
       local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar26 = vfmadd213sd_fma(auVar51,auVar51,auVar26);
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar61._8_8_ = 0;
  auVar61._0_8_ =
       local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
       local_838.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar27 = vfmadd231sd_fma(auVar61,auVar45,auVar45);
  auVar27 = vfmadd231sd_fma(auVar27,auVar56,auVar56);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = auVar27._0_8_ * 3.0;
  auVar26 = vfmadd231sd_fma(auVar46,auVar26,ZEXT816(0x3fe0000000000000));
  if (auVar26._0_8_ < 0.0) {
    dVar39 = sqrt(auVar26._0_8_);
  }
  else {
    auVar26 = vsqrtsd_avx(auVar26,auVar26);
    dVar39 = auVar26._0_8_;
  }
  return dVar39;
}

Assistant:

double ChElementShellANCF_3833::GetVonMissesStress(const double layer,
                                                   const double xi,
                                                   const double eta,
                                                   const double layer_zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    double layer_midsurface_offset =
        -m_thicknessZ / 2 + m_layer_zoffsets[layer] + m_layers[layer].Get_thickness() / 2 + m_midsurfoffset;
    Calc_Sxi_D(Sxi_D, xi, eta, layer_zeta, m_layers[layer].Get_thickness(), layer_midsurface_offset);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    // Calculate the Green-Lagrange strain tensor at the current point in Voigt notation
    ChVectorN<double, 6> epsilon_combined;
    epsilon_combined(0) = 0.5 * (F.col(0).dot(F.col(0)) - 1);
    epsilon_combined(1) = 0.5 * (F.col(1).dot(F.col(1)) - 1);
    epsilon_combined(2) = 0.5 * (F.col(2).dot(F.col(2)) - 1);
    epsilon_combined(3) = F.col(1).dot(F.col(2));
    epsilon_combined(4) = F.col(0).dot(F.col(2));
    epsilon_combined(5) = F.col(0).dot(F.col(1));

    if (m_damping_enabled) {
        Matrix3xN ebardot;  // Element coordinate time derivatives in matrix form
        CalcCoordDerivMatrix(ebardot);

        // Calculate the time derivative of the Deformation Gradient at the current point
        ChMatrixNMc<double, 3, 3> Fdot = ebardot * Sxi_D;

        // Calculate the time derivative of the Green-Lagrange strain tensor in Voigt notation
        // and combine it with epsilon assuming a Linear Kelvin-Voigt Viscoelastic material model
        epsilon_combined(0) += m_Alpha * F.col(0).dot(Fdot.col(0));
        epsilon_combined(1) += m_Alpha * F.col(1).dot(Fdot.col(1));
        epsilon_combined(2) += m_Alpha * F.col(2).dot(Fdot.col(2));
        epsilon_combined(3) += m_Alpha * (F.col(1).dot(Fdot.col(2)) + Fdot.col(1).dot(F.col(2)));
        epsilon_combined(4) += m_Alpha * (F.col(0).dot(Fdot.col(2)) + Fdot.col(0).dot(F.col(2)));
        epsilon_combined(5) += m_Alpha * (F.col(0).dot(Fdot.col(1)) + Fdot.col(0).dot(F.col(1)));
    }

    // Get the stiffness tensor in 6x6 matrix form for the current layer and rotate it in the midsurface according
    // to the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in
    // this element compared to what is used in ChMaterialShellANCF

    ChMatrixNM<double, 6, 6> D = m_layers[layer].GetMaterial()->Get_E_eps();
    RotateReorderStiffnessMatrix(D, m_layers[layer].Get_theta());

    ChVectorN<double, 6> sigmaPK2 = D * epsilon_combined;  // 2nd Piola Kirchhoff Stress tensor in Voigt notation

    ChMatrixNM<double, 3, 3> SPK2;  // 2nd Piola Kirchhoff Stress tensor
    SPK2(0, 0) = sigmaPK2(0);
    SPK2(1, 1) = sigmaPK2(1);
    SPK2(2, 2) = sigmaPK2(2);
    SPK2(1, 2) = sigmaPK2(3);
    SPK2(2, 1) = sigmaPK2(3);
    SPK2(0, 2) = sigmaPK2(4);
    SPK2(2, 0) = sigmaPK2(4);
    SPK2(0, 1) = sigmaPK2(5);
    SPK2(1, 0) = sigmaPK2(5);

    // Convert from 2ndPK Stress to Cauchy Stress
    ChMatrix33<double> S = (F * SPK2 * F.transpose()) / F.determinant();
    double SVonMises =
        sqrt(0.5 * ((S(0, 0) - S(1, 1)) * (S(0, 0) - S(1, 1)) + (S(1, 1) - S(2, 2)) * (S(1, 1) - S(2, 2)) +
                    (S(2, 2) - S(0, 0)) * (S(2, 2) - S(0, 0))) +
             3 * (S(1, 2) * S(1, 2) + S(2, 0) * S(2, 0) + S(0, 1) * S(0, 1)));

    return (SVonMises);
}